

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpack.cxx
# Opt level: O0

int cpackDefinitionArgument(char *argument,char *cValue,void *call_data)

{
  cmCPackLog *pcVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  long lVar5;
  mapped_type *this;
  string local_3c8 [32];
  undefined1 local_3a8 [8];
  ostringstream cmCPackLog_msg_1;
  undefined1 local_230 [8];
  string key;
  string local_208 [32];
  undefined1 local_1e8 [8];
  ostringstream cmCPackLog_msg;
  size_t pos;
  allocator local_51;
  string local_50 [8];
  string value;
  cpackDefinitions *def;
  void *call_data_local;
  char *cValue_local;
  char *argument_local;
  
  value.field_2._8_8_ = call_data;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,cValue,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  lVar2 = std::__cxx11::string::find_first_of((char *)local_50,0x9a4981);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)local_230,(ulong)local_50);
    lVar5 = std::__cxx11::string::c_str();
    std::__cxx11::string::operator=(local_50,(char *)(lVar5 + 1 + lVar2));
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)value.field_2._8_8_,(key_type *)local_230);
    std::__cxx11::string::operator=((string *)this,local_50);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
    poVar3 = std::operator<<((ostream *)local_3a8,"Set CPack variable: ");
    poVar3 = std::operator<<(poVar3,(string *)local_230);
    poVar3 = std::operator<<(poVar3," to \"");
    poVar3 = std::operator<<(poVar3,local_50);
    poVar3 = std::operator<<(poVar3,"\"");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = *(cmCPackLog **)(value.field_2._8_8_ + 0x30);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cpack.cxx"
                    ,0x5d,pcVar4);
    std::__cxx11::string::~string(local_3c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
    key.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_230);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    poVar3 = std::operator<<((ostream *)local_1e8,"Please specify CPack definitions as: KEY=VALUE");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = *(cmCPackLog **)(value.field_2._8_8_ + 0x30);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cpack.cxx"
                    ,0x56,pcVar4);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    key.field_2._12_4_ = 1;
  }
  argument_local._4_4_ = (uint)(lVar2 != -1);
  std::__cxx11::string::~string(local_50);
  return argument_local._4_4_;
}

Assistant:

int cpackDefinitionArgument(const char* argument, const char* cValue,
  void* call_data)
{
  (void)argument;
  cpackDefinitions* def = static_cast<cpackDefinitions*>(call_data);
  std::string value = cValue;
  size_t pos = value.find_first_of("=");
  if ( pos == std::string::npos )
    {
    cmCPack_Log(def->Log, cmCPackLog::LOG_ERROR,
      "Please specify CPack definitions as: KEY=VALUE" << std::endl);
    return 0;
    }
  std::string key = value.substr(0, pos);
  value = value.c_str() + pos + 1;
  def->Map[key] = value;
  cmCPack_Log(def->Log, cmCPackLog::LOG_DEBUG, "Set CPack variable: "
    << key << " to \"" << value << "\"" << std::endl);
  return 1;
}